

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

bool __thiscall
cmSourceFileLocation::MatchesAmbiguousExtension
          (cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  __type _Var4;
  bool bVar5;
  cmake *this_00;
  basic_string_view<char,_std::char_traits<char>_> ext;
  string_view prefix;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x8b,
                  "bool cmSourceFileLocation::MatchesAmbiguousExtension(const cmSourceFileLocation &) const"
                 );
  }
  _Var4 = std::operator==(&this->Name,&loc->Name);
  bVar5 = true;
  if (!_Var4) {
    uVar1 = (this->Name)._M_string_length;
    uVar2 = (loc->Name)._M_string_length;
    if (((uVar2 < uVar1) && (pcVar3 = (this->Name)._M_dataplus._M_p, pcVar3[uVar2] == '.')) &&
       (prefix._M_str = (loc->Name)._M_dataplus._M_p, prefix._M_len = uVar2, str._M_str = pcVar3,
       str._M_len = uVar1, bVar5 = cmHasPrefix(str,prefix), bVar5)) {
      local_30._M_str = (this->Name)._M_dataplus._M_p;
      local_30._M_len = (this->Name)._M_string_length;
      ext = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_30,(loc->Name)._M_string_length + 1,0xffffffffffffffff);
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      bVar5 = cmake::IsAKnownExtension(this_00,ext);
      return bVar5;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmSourceFileLocation::MatchesAmbiguousExtension(
  cmSourceFileLocation const& loc) const
{
  assert(this->Makefile);
  // This location's extension is not ambiguous but loc's extension
  // is.  See if the names match as-is.
  if (this->Name == loc.Name) {
    return true;
  }

  // Check if loc's name could possibly be extended to our name by
  // adding an extension.
  if (!(this->Name.size() > loc.Name.size() &&
        this->Name[loc.Name.size()] == '.' &&
        cmHasPrefix(this->Name, loc.Name))) {
    return false;
  }

  // Only a fixed set of extensions will be tried to match a file on
  // disk.  One of these must match if loc refers to this source file.
  auto ext = cm::string_view(this->Name).substr(loc.Name.size() + 1);
  cmMakefile const* mf = this->Makefile;
  auto* cm = mf->GetCMakeInstance();
  return cm->IsAKnownExtension(ext);
}